

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_lex.c
# Opt level: O0

void * yyrealloc(void *ptr,yy_size_t size,yyscan_t yyscanner)

{
  void *pvVar1;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  yy_size_t size_local;
  void *ptr_local;
  
  pvVar1 = realloc(ptr,size);
  return pvVar1;
}

Assistant:

void *yyrealloc  (void * ptr, yy_size_t  size , yyscan_t yyscanner)
{
	struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	(void)yyg;

	/* The cast to (char *) in the following accommodates both
	 * implementations that use char* generic pointers, and those
	 * that use void* generic pointers.  It works with the latter
	 * because both ANSI C and C++ allow castless assignment from
	 * any pointer type to void*, and deal with argument conversions
	 * as though doing an assignment.
	 */
	return realloc(ptr, size);
}